

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filestream.c
# Opt level: O1

ktx_error_code_e ktxFileStream_getpos(ktxStream *str,ktx_off_t *pos)

{
  __off_t _Var1;
  int *piVar2;
  
  if (pos == (ktx_off_t *)0x0 || str == (ktxStream *)0x0) {
    return KTX_INVALID_VALUE;
  }
  if (str->type != eStreamTypeFile) {
    __assert_fail("str->type == eStreamTypeFile",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/filestream.c"
                  ,0xcb,"ktx_error_code_e ktxFileStream_getpos(ktxStream *, ktx_off_t *)");
  }
  if ((FILE *)(str->data).file == _stdin) {
    _Var1 = str->readpos;
  }
  else {
    _Var1 = ftello((FILE *)(str->data).file);
    if (_Var1 < 0) {
      piVar2 = __errno_location();
      if (*piVar2 == 0x1d) {
        return KTX_FILE_ISPIPE;
      }
      if (*piVar2 == 0x4b) {
        return KTX_FILE_OVERFLOW;
      }
    }
  }
  *pos = _Var1;
  return KTX_SUCCESS;
}

Assistant:

static
KTX_error_code ktxFileStream_getpos(ktxStream* str, ktx_off_t* pos)
{
    ktx_off_t ftellval;

    if (!str || !pos)
        return KTX_INVALID_VALUE;

    assert(str->type == eStreamTypeFile);

    if (str->data.file == stdin) {
        *pos = str->readpos;
    } else {
        /* The cast quiets an Xcode warning when building for "Generic iOS Device".
         * I'm not sure why.
         */
        ftellval = (ktx_off_t)ftello(str->data.file);
        if (ftellval < 0) {
            switch (errno) {
              case ESPIPE: return KTX_FILE_ISPIPE;
              case EOVERFLOW: return KTX_FILE_OVERFLOW;
            }
        }

        *pos = ftellval;
    }

    return KTX_SUCCESS;
}